

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O2

int ncnn::binary_op_no_broadcast<ncnn::BinaryOp_x86_avx512_functor::binary_op_div>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [64];
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  int iVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 in_ZMM3 [64];
  
  iVar11 = a->h * a->w * a->d * a->elempack;
  uVar15 = 0;
  uVar12 = (ulong)(uint)a->c;
  if (a->c < 1) {
    uVar12 = uVar15;
  }
  for (; uVar15 != uVar12; uVar15 = uVar15 + 1) {
    pvVar6 = a->data;
    pvVar7 = b->data;
    pvVar8 = c->data;
    lVar19 = c->elemsize * c->cstep * uVar15;
    lVar21 = b->elemsize * b->cstep * uVar15;
    lVar20 = a->elemsize * a->cstep * uVar15;
    lVar14 = 0;
    for (iVar13 = 0; iVar13 + 0xf < iVar11; iVar13 = iVar13 + 0x10) {
      auVar23 = *(undefined1 (*) [64])((long)pvVar7 + lVar14 + lVar21);
      auVar22 = vrcp14ps_avx512f(auVar23);
      auVar5 = *(undefined1 (*) [64])((long)pvVar6 + lVar14 + lVar20);
      in_ZMM3 = vmulps_avx512f(auVar5,auVar22);
      auVar23 = vfmsub213ps_avx512f(auVar23,in_ZMM3,auVar5);
      auVar23 = vfnmadd213ps_avx512f(auVar23,auVar22,in_ZMM3);
      *(undefined1 (*) [64])((long)pvVar8 + lVar14 + lVar19) = auVar23;
      lVar14 = lVar14 + 0x40;
    }
    for (; iVar13 + 7 < iVar11; iVar13 = iVar13 + 8) {
      auVar3 = *(undefined1 (*) [32])((long)pvVar7 + lVar14 + lVar21);
      auVar10 = vrcpps_avx(auVar3);
      auVar4 = *(undefined1 (*) [32])((long)pvVar6 + lVar14 + lVar20);
      auVar23._0_4_ = auVar4._0_4_ * auVar10._0_4_;
      auVar23._4_4_ = auVar4._4_4_ * auVar10._4_4_;
      auVar23._8_4_ = auVar4._8_4_ * auVar10._8_4_;
      auVar23._12_4_ = auVar4._12_4_ * auVar10._12_4_;
      auVar23._16_4_ = auVar4._16_4_ * auVar10._16_4_;
      auVar23._20_4_ = auVar4._20_4_ * auVar10._20_4_;
      auVar23._28_36_ = in_ZMM3._28_36_;
      auVar23._24_4_ = auVar4._24_4_ * auVar10._24_4_;
      auVar25 = auVar23._0_32_;
      in_ZMM3 = ZEXT3264(auVar25);
      auVar1 = vfmsub213ps_fma(auVar3,auVar25,auVar4);
      auVar1 = vfnmadd213ps_fma(ZEXT1632(auVar1),auVar10,auVar25);
      *(undefined1 (*) [32])((long)pvVar8 + lVar14 + lVar19) = ZEXT1632(auVar1);
      lVar14 = lVar14 + 0x20;
    }
    for (; iVar13 + 3 < iVar11; iVar13 = iVar13 + 4) {
      auVar1 = *(undefined1 (*) [16])((long)pvVar6 + lVar14 + lVar20);
      auVar2 = *(undefined1 (*) [16])((long)pvVar7 + lVar14 + lVar21);
      auVar9 = vrcpps_avx(auVar2);
      auVar24._0_4_ = auVar1._0_4_ * auVar9._0_4_;
      auVar24._4_4_ = auVar1._4_4_ * auVar9._4_4_;
      auVar24._8_4_ = auVar1._8_4_ * auVar9._8_4_;
      auVar24._12_4_ = auVar1._12_4_ * auVar9._12_4_;
      in_ZMM3 = ZEXT1664(auVar24);
      auVar1 = vfmsub213ps_fma(auVar2,auVar24,auVar1);
      auVar1 = vfnmadd213ps_fma(auVar1,auVar9,auVar24);
      *(undefined1 (*) [16])((long)pvVar8 + lVar14 + lVar19) = auVar1;
      lVar14 = lVar14 + 0x10;
    }
    pfVar18 = (float *)((long)pvVar8 + lVar19 + lVar14);
    pfVar17 = (float *)((long)pvVar7 + lVar21 + lVar14);
    pfVar16 = (float *)((long)pvVar6 + lVar20 + lVar14);
    for (; iVar13 < iVar11; iVar13 = iVar13 + 1) {
      *pfVar18 = *pfVar16 / *pfVar17;
      pfVar16 = pfVar16 + 1;
      pfVar17 = pfVar17 + 1;
      pfVar18 = pfVar18 + 1;
    }
  }
  return iVar11;
}

Assistant:

static int binary_op_no_broadcast(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    const int channels = a.c;
    const int size = a.w * a.h * a.d * a.elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}